

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O3

void aes_init_dec_x86(aes_context *ctx,uint8_t *key)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  uint32_t *puVar4;
  aes_context *paVar5;
  long lVar6;
  undefined1 auVar7 [16];
  aes_context enc;
  aes_context local_138;
  
  local_138.nr = ctx->nr;
  lVar6 = (long)local_138.nr;
  aes_init_x86(&local_138,key);
  *(undefined8 *)(ctx->key + lVar6 * 4) = local_138.key._0_8_;
  *(undefined8 *)(ctx->key + lVar6 * 4 + 2) = local_138.key._8_8_;
  uVar2 = (ulong)ctx->nr;
  if (1 < uVar2) {
    uVar3 = 1;
    puVar4 = local_138.key;
    paVar5 = ctx;
    do {
      puVar4 = puVar4 + 4;
      auVar7 = aesimc(*(undefined1 (*) [16])puVar4);
      *(undefined1 (*) [16])(paVar5->key + uVar2 * 4 + -4) = auVar7;
      uVar3 = uVar3 + 1;
      uVar2 = (ulong)ctx->nr;
      paVar5 = (aes_context *)(paVar5[-1].key + 0x40);
    } while (uVar3 < uVar2);
  }
  uVar1 = *(undefined8 *)(local_138.key + uVar2 * 4 + 2);
  *(undefined8 *)ctx->key = *(undefined8 *)(local_138.key + uVar2 * 4);
  *(undefined8 *)(ctx->key + 2) = uVar1;
  return;
}

Assistant:

void aes_init_dec_x86(aes_context* ctx, const uint8_t* key)
{
  aes_context enc;
  enc.nr = ctx->nr;
  aes_init_x86(&enc, key);

  const __m128i* ekey = (__m128i*)&enc.key;
  __m128i* dkey = (__m128i*)&ctx->key;

  _mm_store_si128(dkey + ctx->nr, _mm_load_si128(ekey + 0));
  for (size_t i = 1; i < ctx->nr; i++)
  {
    _mm_store_si128(dkey + ctx->nr - i, _mm_aesimc_si128(_mm_load_si128(ekey + i)));
  }
  _mm_store_si128(dkey + 0, _mm_load_si128(ekey + ctx->nr));
}